

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderGetParserProp(xmlTextReaderPtr reader,int prop)

{
  xmlParserCtxtPtr pxVar1;
  xmlParserCtxtPtr ctxt;
  xmlParserProperties p;
  int prop_local;
  xmlTextReaderPtr reader_local;
  
  if ((reader == (xmlTextReaderPtr)0x0) || (reader->ctxt == (xmlParserCtxtPtr)0x0)) {
    reader_local._4_4_ = ~XML_TEXTREADER_NOT_VALIDATE;
  }
  else {
    pxVar1 = reader->ctxt;
    switch(prop) {
    case 1:
      if ((pxVar1->loadsubset == 0) && (pxVar1->validate == 0)) {
        reader_local._4_4_ = XML_TEXTREADER_NOT_VALIDATE;
      }
      else {
        reader_local._4_4_ = XML_TEXTREADER_VALIDATE_DTD;
      }
      break;
    case 2:
      if ((pxVar1->loadsubset & 4U) == 0) {
        reader_local._4_4_ = XML_TEXTREADER_NOT_VALIDATE;
      }
      else {
        reader_local._4_4_ = XML_TEXTREADER_VALIDATE_DTD;
      }
      break;
    case 3:
      reader_local._4_4_ = reader->validate;
      break;
    case 4:
      reader_local._4_4_ = pxVar1->replaceEntities;
      break;
    default:
      reader_local._4_4_ = ~XML_TEXTREADER_NOT_VALIDATE;
    }
  }
  return reader_local._4_4_;
}

Assistant:

int
xmlTextReaderGetParserProp(xmlTextReaderPtr reader, int prop) {
    xmlParserProperties p = (xmlParserProperties) prop;
    xmlParserCtxtPtr ctxt;

    if ((reader == NULL) || (reader->ctxt == NULL))
	return(-1);
    ctxt = reader->ctxt;

    switch (p) {
        case XML_PARSER_LOADDTD:
	    if ((ctxt->loadsubset != 0) || (ctxt->validate != 0))
		return(1);
	    return(0);
        case XML_PARSER_DEFAULTATTRS:
	    if (ctxt->loadsubset & XML_COMPLETE_ATTRS)
		return(1);
	    return(0);
        case XML_PARSER_VALIDATE:
	    return(reader->validate);
	case XML_PARSER_SUBST_ENTITIES:
	    return(ctxt->replaceEntities);
    }
    return(-1);
}